

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::~RepeatedField(RepeatedField<unsigned_long> *this)

{
  bool is_soo_00;
  int iVar1;
  Arena *this_00;
  unsigned_long *begin;
  unsigned_long *elem;
  int size;
  Arena *arena;
  bool is_soo;
  RepeatedField<unsigned_long> *this_local;
  
  is_soo_00 = RepeatedField<unsigned_long>::is_soo(this);
  this_00 = GetArena(this,is_soo_00);
  if (this_00 != (Arena *)0x0) {
    Arena::SpaceAllocated(this_00);
  }
  iVar1 = RepeatedField<unsigned_long>::size(this,is_soo_00);
  if (0 < iVar1) {
    begin = unsafe_elements(this,is_soo_00);
    Destroy(begin,begin + iVar1);
  }
  UnpoisonBuffer(this);
  if (!is_soo_00) {
    InternalDeallocate<true>(this);
  }
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
  StaticValidityCheck();
  const bool is_soo = this->is_soo();
#ifndef NDEBUG
  // Try to trigger segfault / asan failure in non-opt builds if arena_
  // lifetime has ended before the destructor.
  auto arena = GetArena(is_soo);
  if (arena) (void)arena->SpaceAllocated();
#endif
  const int size = this->size(is_soo);
  if (size > 0) {
    Element* elem = unsafe_elements(is_soo);
    Destroy(elem, elem + size);
  }
  UnpoisonBuffer();
  if (!is_soo) InternalDeallocate<true>();
}